

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

void __thiscall disp::h1_d(disp *this,double param)

{
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  to_string<double>(&local_50,param);
  std::operator+(&local_30,"h1_d:",&local_50);
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void h1_d(double param)
	{
		v_= "h1_d:"+to_string(param);
	}